

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXExportProperty::DumpAscii
          (FBXExportProperty *this,StreamWriterLE *outstream,int indent)

{
  ostringstream ss;
  locale local_1c0 [8];
  string local_1b8;
  long local_198;
  undefined8 local_190 [13];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::locale::classic();
  std::ios::imbue(local_1c0);
  std::locale::~locale(local_1c0);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0xf;
  DumpAscii(this,(ostream *)&local_198,indent);
  std::__cxx11::stringbuf::str();
  StreamWriter<false,_false>::PutString(outstream,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void FBXExportProperty::DumpAscii(Assimp::StreamWriterLE& outstream, int indent) {
    std::ostringstream ss;
    ss.imbue(std::locale::classic());
    ss.precision(15); // this seems to match official FBX SDK exports
    DumpAscii(ss, indent);
    outstream.PutString(ss.str());
}